

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  undefined4 in_register_00000034;
  undefined1 auStack_d8 [4];
  int i;
  timeval tv;
  int maxFd;
  fd_set *__arr;
  undefined1 local_b0 [4];
  uint __i;
  fd_set fdr;
  uint *streams_local;
  usize length_local;
  void *buffer_local;
  Process *this_local;
  
  fdr.fds_bits[0xf] = __nbytes;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    fdr.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  tv.tv_usec._4_4_ = 0;
  if (((*(uint *)__nbytes & 1) != 0) && (this->fdStdOutRead != 0)) {
    lVar4 = (long)(this->fdStdOutRead / 0x40);
    fdr.fds_bits[lVar4 + -1] =
         1L << ((byte)((long)this->fdStdOutRead % 0x40) & 0x3f) | fdr.fds_bits[lVar4 + -1];
    tv.tv_usec._4_4_ = this->fdStdOutRead;
  }
  if ((((*(uint *)fdr.fds_bits[0xf] & 2) != 0) && (this->fdStdErrRead != 0)) &&
     (lVar4 = (long)(this->fdStdErrRead / 0x40),
     fdr.fds_bits[lVar4 + -1] =
          1L << ((byte)((long)this->fdStdErrRead % 0x40) & 0x3f) | fdr.fds_bits[lVar4 + -1],
     tv.tv_usec._4_4_ < this->fdStdErrRead)) {
    tv.tv_usec._4_4_ = this->fdStdErrRead;
  }
  if (tv.tv_usec._4_4_ == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    _auStack_d8 = 1000;
    tv.tv_sec = 0;
    do {
      do {
        iVar1 = select(tv.tv_usec._4_4_ + 1,(fd_set *)local_b0,(fd_set *)0x0,(fd_set *)0x0,
                       (timeval *)auStack_d8);
      } while (iVar1 == 0);
      if (iVar1 != -1) {
        if ((((*(uint *)fdr.fds_bits[0xf] & 1) != 0) && (this->fdStdOutRead != 0)) &&
           ((fdr.fds_bits[(long)(this->fdStdOutRead / 0x40) + -1] &
            1L << ((byte)((long)this->fdStdOutRead % 0x40) & 0x3f)) != 0)) {
          *(undefined4 *)fdr.fds_bits[0xf] = 1;
          sVar3 = ::read(this->fdStdOutRead,(void *)CONCAT44(in_register_00000034,__fd),
                         (size_t)__buf);
          return sVar3;
        }
        if ((((*(uint *)fdr.fds_bits[0xf] & 2) != 0) && (this->fdStdErrRead != 0)) &&
           ((fdr.fds_bits[(long)(this->fdStdErrRead / 0x40) + -1] &
            1L << ((byte)((long)this->fdStdErrRead % 0x40) & 0x3f)) != 0)) {
          *(undefined4 *)fdr.fds_bits[0xf] = 2;
          sVar3 = ::read(this->fdStdErrRead,(void *)CONCAT44(in_register_00000034,__fd),
                         (size_t)__buf);
          return sVar3;
        }
        return -1;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return -1;
}

Assistant:

ssize Process::read(void* buffer, usize length, uint& streams)
{
#ifdef _WIN32
  HANDLE handles[2];
  DWORD handleCount = 0;
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdOutRead;
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdErrRead;
  if(handleCount == 0)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return -1;
  }
  DWORD dw = WaitForMultipleObjects(handleCount, handles, FALSE, INFINITE);
  if(dw < WAIT_OBJECT_0 || dw >= WAIT_OBJECT_0 + handleCount)
    return -1;
  HANDLE readHandle = handles[dw - WAIT_OBJECT_0];
  streams = readHandle == hStdOutRead ? stdoutStream : stderrStream;
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(length > (usize)INT_MAX)
  {
    if(!ReadFile(readHandle, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    length -= INT_MAX;
  }
  if(!ReadFile(readHandle, buffer, (DWORD)length, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(readHandle, buffer, length, &i, NULL))
    return -1;
  return i;
#endif
#else
  fd_set fdr;
  FD_ZERO(&fdr);
  int maxFd = 0;
  if(streams & stdoutStream && fdStdOutRead)
  {
    FD_SET(fdStdOutRead, &fdr);
    maxFd = fdStdOutRead;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    FD_SET(fdStdErrRead, &fdr);
    if(fdStdErrRead > maxFd)
      maxFd = fdStdErrRead;
  }
  if(maxFd == 0)
  {
    errno = EINVAL;
    return -1;
  }
  timeval tv = {1000, 0};
  for(;;)
  {
    int i = select(maxFd + 1, &fdr, 0, 0, &tv);
    if(i == 0)
      continue;
    if(i == -1)
    {
      if (errno == EINTR)
        continue;
      return -1;
    }
    break;
  }
  if(streams & stdoutStream && fdStdOutRead && FD_ISSET(fdStdOutRead, &fdr))
  {
    streams = stdoutStream;
    return ::read(fdStdOutRead, buffer, length);
  }
  if(streams & stderrStream && fdStdErrRead && FD_ISSET(fdStdErrRead, &fdr))
  {
    streams = stderrStream;
    return ::read(fdStdErrRead, buffer, length);
  }
  return -1;
#endif
}